

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

void __thiscall CFFFileInput::FreeData(CFFFileInput *this)

{
  FontDictInfo *pFVar1;
  CharStrings *pCVar2;
  FontDictInfo **ppFVar3;
  TopDictInfo *pTVar4;
  CharStringsIndex pCVar5;
  PrivateDictInfo *pPVar6;
  CharSetInfo *this_00;
  EncodingsInfo *this_01;
  bool bVar7;
  FontDictInfo *this_02;
  TopDictInfo *this_03;
  PrivateDictInfo *this_04;
  pointer ppVar8;
  reference ppCVar9;
  reference ppEVar10;
  __normal_iterator<EncodingsInfo_**,_std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>_>
  local_58;
  __normal_iterator<EncodingsInfo_**,_std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>_>
  local_50;
  iterator itEncodings;
  __normal_iterator<CharSetInfo_**,_std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>_>
  local_40;
  iterator itCharSets;
  _Self local_30;
  iterator itLocalSubrs;
  unsigned_long i_2;
  unsigned_long i_1;
  unsigned_long i;
  CFFFileInput *this_local;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mName);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::clear(&this->mNameToIndex);
  if (this->mTopDictIndex != (TopDictInfo *)0x0) {
    for (i_1 = 0; i_1 < this->mFontsCount; i_1 = i_1 + 1) {
      pFVar1 = this->mTopDictIndex[i_1].mFDArray;
      if (pFVar1 != (FontDictInfo *)0x0) {
        pCVar2 = pFVar1[-1].mPrivateDict.mLocalSubrs;
        this_02 = pFVar1 + (long)pCVar2;
        while (this_02 != pFVar1) {
          this_02 = this_02 + -1;
          FontDictInfo::~FontDictInfo(this_02);
        }
        operator_delete__(&pFVar1[-1].mPrivateDict.mLocalSubrs,(long)pCVar2 * 0x88 + 8);
      }
      ppFVar3 = this->mTopDictIndex[i_1].mFDSelect;
      if (ppFVar3 != (FontDictInfo **)0x0) {
        operator_delete__(ppFVar3);
      }
    }
    pTVar4 = this->mTopDictIndex;
    if (pTVar4 != (TopDictInfo *)0x0) {
      ppFVar3 = pTVar4[-1].mFDSelect;
      this_03 = pTVar4 + (long)ppFVar3;
      while (pTVar4 != this_03) {
        this_03 = this_03 + -1;
        TopDictInfo::~TopDictInfo(this_03);
      }
      operator_delete__(&pTVar4[-1].mFDSelect,(long)ppFVar3 * 0x50 + 8);
    }
    this->mTopDictIndex = (TopDictInfo *)0x0;
  }
  if (this->mStrings != (char **)0x0) {
    for (i_2 = 0; i_2 < this->mStringsCount; i_2 = i_2 + 1) {
      if (this->mStrings[i_2] != (char *)0x0) {
        operator_delete__(this->mStrings[i_2]);
      }
    }
    if (this->mStrings != (char **)0x0) {
      operator_delete__(this->mStrings);
    }
    this->mStrings = (char **)0x0;
  }
  std::
  map<const_char_*,_unsigned_short,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::clear(&this->mStringToSID);
  pCVar5 = (this->mGlobalSubrs).mCharStringsIndex;
  if (pCVar5 != (CharStringsIndex)0x0) {
    operator_delete__(pCVar5);
  }
  (this->mGlobalSubrs).mCharStringsIndex = (CharStringsIndex)0x0;
  if (this->mCharStrings != (CharStrings *)0x0) {
    for (itLocalSubrs._M_node = (_Base_ptr)0x0;
        itLocalSubrs._M_node < (_Base_ptr)(ulong)this->mFontsCount;
        itLocalSubrs._M_node = (_Base_ptr)((long)&(itLocalSubrs._M_node)->_M_color + 1)) {
      pCVar5 = this->mCharStrings[(long)itLocalSubrs._M_node].mCharStringsIndex;
      if (pCVar5 != (CharStringsIndex)0x0) {
        operator_delete__(pCVar5);
      }
    }
    if (this->mCharStrings != (CharStrings *)0x0) {
      operator_delete(this->mCharStrings,0x10);
    }
    this->mCharStrings = (CharStrings *)0x0;
  }
  pPVar6 = this->mPrivateDicts;
  if (pPVar6 != (PrivateDictInfo *)0x0) {
    pCVar2 = pPVar6[-1].mLocalSubrs;
    this_04 = pPVar6 + (long)pCVar2;
    while (pPVar6 != this_04) {
      this_04 = this_04 + -1;
      PrivateDictInfo::~PrivateDictInfo(this_04);
    }
    operator_delete__(&pPVar6[-1].mLocalSubrs,(long)pCVar2 * 0x48 + 8);
  }
  this->mPrivateDicts = (PrivateDictInfo *)0x0;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<long_long,_CharStrings_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_CharStrings_*>_>_>
       ::begin(&this->mLocalSubrs);
  while( true ) {
    itCharSets._M_current =
         (CharSetInfo **)
         std::
         map<long_long,_CharStrings_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_CharStrings_*>_>_>
         ::end(&this->mLocalSubrs);
    bVar7 = std::operator!=(&local_30,(_Self *)&itCharSets);
    if (!bVar7) break;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_long_long,_CharStrings_*>_>::operator->
                       (&local_30);
    pCVar5 = ppVar8->second->mCharStringsIndex;
    if (pCVar5 != (CharStringsIndex)0x0) {
      operator_delete__(pCVar5);
    }
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_long_long,_CharStrings_*>_>::operator->
                       (&local_30);
    if (ppVar8->second != (CharStrings *)0x0) {
      operator_delete(ppVar8->second,0x10);
    }
    std::_Rb_tree_iterator<std::pair<const_long_long,_CharStrings_*>_>::operator++(&local_30);
  }
  local_40._M_current =
       (CharSetInfo **)
       std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>::begin(&this->mCharSets);
  while( true ) {
    itEncodings._M_current =
         (EncodingsInfo **)
         std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>::end(&this->mCharSets);
    bVar7 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<CharSetInfo_**,_std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>_>
                        *)&itEncodings);
    if (!bVar7) break;
    ppCVar9 = __gnu_cxx::
              __normal_iterator<CharSetInfo_**,_std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>_>
              ::operator*(&local_40);
    if ((*ppCVar9)->mSIDs != (unsigned_short *)0x0) {
      operator_delete__((*ppCVar9)->mSIDs);
    }
    ppCVar9 = __gnu_cxx::
              __normal_iterator<CharSetInfo_**,_std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>_>
              ::operator*(&local_40);
    std::
    map<unsigned_short,_IndexElement_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
    ::clear(&(*ppCVar9)->mSIDToGlyphMap);
    ppCVar9 = __gnu_cxx::
              __normal_iterator<CharSetInfo_**,_std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>_>
              ::operator*(&local_40);
    this_00 = *ppCVar9;
    if (this_00 != (CharSetInfo *)0x0) {
      CharSetInfo::~CharSetInfo(this_00);
      operator_delete(this_00,0x40);
    }
    __gnu_cxx::
    __normal_iterator<CharSetInfo_**,_std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>_>::
    operator++(&local_40);
  }
  std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>::clear(&this->mCharSets);
  local_50._M_current =
       (EncodingsInfo **)
       std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::begin(&this->mEncodings);
  while( true ) {
    local_58._M_current =
         (EncodingsInfo **)
         std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::end(&this->mEncodings);
    bVar7 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar7) break;
    ppEVar10 = __gnu_cxx::
               __normal_iterator<EncodingsInfo_**,_std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>_>
               ::operator*(&local_50);
    if ((*ppEVar10)->mEncoding != (Byte *)0x0) {
      operator_delete__((*ppEVar10)->mEncoding);
    }
    ppEVar10 = __gnu_cxx::
               __normal_iterator<EncodingsInfo_**,_std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>_>
               ::operator*(&local_50);
    this_01 = *ppEVar10;
    if (this_01 != (EncodingsInfo *)0x0) {
      EncodingsInfo::~EncodingsInfo(this_01);
      operator_delete(this_01,0x50);
    }
    __gnu_cxx::
    __normal_iterator<EncodingsInfo_**,_std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>_>
    ::operator++(&local_50);
  }
  std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::clear(&this->mEncodings);
  return;
}

Assistant:

void CFFFileInput::FreeData()
{
	mName.clear();
	mNameToIndex.clear();
	if(mTopDictIndex != NULL)
	{
		for(unsigned long i=0; i < mFontsCount;++i)
		{
			delete[] mTopDictIndex[i].mFDArray;
			delete[] mTopDictIndex[i].mFDSelect;
		}
		delete[] mTopDictIndex;
		mTopDictIndex = NULL;
	}
	if(mStrings != NULL)
	{
		for(unsigned long i =0 ; i <mStringsCount; ++ i)
			delete[] mStrings[i];
		delete[] mStrings;
		mStrings = NULL;
	}
	mStringToSID.clear();
	delete[] mGlobalSubrs.mCharStringsIndex;
	mGlobalSubrs.mCharStringsIndex = NULL;
	if(mCharStrings != NULL)
	{
		for(unsigned long i=0; i < mFontsCount; ++i)
			delete[] mCharStrings[i].mCharStringsIndex;
		delete mCharStrings;
		mCharStrings = NULL;
	}
	delete[] mPrivateDicts;
	mPrivateDicts = NULL;

	LongFilePositionTypeToCharStringsMap::iterator itLocalSubrs = mLocalSubrs.begin();
	for(; itLocalSubrs != mLocalSubrs.end(); ++itLocalSubrs)
	{
		delete[] itLocalSubrs->second->mCharStringsIndex;
		delete itLocalSubrs->second;
	}

	CharSetInfoVector::iterator itCharSets = mCharSets.begin();
	for(; itCharSets != mCharSets.end(); ++itCharSets)
	{
		delete[] (*itCharSets)->mSIDs;
		(*itCharSets)->mSIDToGlyphMap.clear();
		delete (*itCharSets);
	}
	mCharSets.clear();

	EncodingsInfoVector::iterator itEncodings = mEncodings.begin();
	for(; itEncodings != mEncodings.end(); ++itEncodings)
	{
		delete[] (*itEncodings)->mEncoding;
		delete (*itEncodings);
	}
	mEncodings.clear();
}